

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void os_gen_rand_bytes(uchar *buf,size_t len)

{
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> eng;
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  std::
  generate<unsigned_char*,std::reference_wrapper<std::independent_bits_engine<std::random_device,8ul,unsigned_char>>>
            (buf,buf + len,
             (independent_bits_engine<std::random_device,_8UL,_unsigned_char> *)&local_13a0);
  std::random_device::~random_device(&local_13a0);
  return;
}

Assistant:

void os_gen_rand_bytes( unsigned char* buf, size_t len )
{
    std::independent_bits_engine
            <std::random_device, CHAR_BIT, unsigned char> eng;
    std::generate(buf, buf + len, std::ref(eng));
}